

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O0

void ourWriteOut(OperationConfig *config,per_transfer *per,CURLcode per_result)

{
  char cVar1;
  CURLcode CVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  FILE *pFVar6;
  char *__modes;
  byte local_3b9;
  FILE *stream2;
  size_t flen;
  char fname [512];
  long lStack_1a0;
  _Bool append;
  curl_header *header;
  char hname [256];
  char *local_90;
  writeoutvar find;
  writeoutvar *wv;
  size_t vlen;
  char *end;
  dynbuf name;
  _Bool fclose_stream;
  char *pcStack_38;
  _Bool done;
  char *ptr;
  char *writeinfo;
  FILE *stream;
  CURLcode per_result_local;
  per_transfer *per_local;
  OperationConfig *config_local;
  
  writeinfo = _stdout;
  pcStack_38 = config->writeout;
  name.toobig._7_1_ = 0;
  name.toobig._6_1_ = 0;
  if (pcStack_38 != (char *)0x0) {
    curlx_dyn_init((dynbuf *)&end,0x18);
    while( true ) {
      local_3b9 = 0;
      if ((pcStack_38 != (char *)0x0) && (local_3b9 = 0, *pcStack_38 != '\0')) {
        local_3b9 = name.toobig._7_1_ ^ 0xff;
      }
      if ((local_3b9 & 1) == 0) break;
      if ((*pcStack_38 == '%') && (pcStack_38[1] != '\0')) {
        if (pcStack_38[1] == '%') {
          fputc(0x25,(FILE *)writeinfo);
          pcStack_38 = pcStack_38 + 2;
        }
        else if (pcStack_38[1] == '{') {
          find.writefunc = (_func_int_FILE_ptr_writeoutvar_ptr_per_transfer_ptr_CURLcode__Bool *)0x0
          ;
          memset(&local_90,0,0x18);
          pcVar4 = strchr(pcStack_38,0x7d);
          pcStack_38 = pcStack_38 + 2;
          if (pcVar4 == (char *)0x0) {
            fputs("%{",(FILE *)writeinfo);
          }
          else {
            curlx_dyn_reset((dynbuf *)&end);
            CVar2 = curlx_dyn_addn((dynbuf *)&end,pcStack_38,(long)pcVar4 - (long)pcStack_38);
            if (CVar2 == CURLE_OK) {
              local_90 = curlx_dyn_ptr((dynbuf *)&end);
              find.writefunc =
                   (_func_int_FILE_ptr_writeoutvar_ptr_per_transfer_ptr_CURLcode__Bool *)
                   bsearch(&local_90,variables,0x48,0x18,matchvar);
            }
            if (find.writefunc ==
                (_func_int_FILE_ptr_writeoutvar_ptr_per_transfer_ptr_CURLcode__Bool *)0x0) {
              curl_mfprintf(tool_stderr,"curl: unknown --write-out variable: \'%.*s\'\n",
                            (long)pcVar4 - (long)pcStack_38 & 0xffffffff,pcStack_38);
            }
            else {
              iVar3 = *(int *)(find.writefunc + 8);
              if (iVar3 == 0xd) {
                headerJSON((FILE *)writeinfo,per);
              }
              else if (iVar3 == 0x27) {
                ourWriteOutJSON((FILE *)writeinfo,variables,0x48,per,per_result);
              }
              else if (iVar3 == 0x2f) {
                if (per_result == CURLE_OK) {
                  name.toobig._7_1_ = 1;
                }
              }
              else if (iVar3 == 0x43) {
                if ((name.toobig._6_1_ & 1) != 0) {
                  fclose((FILE *)writeinfo);
                }
                name.toobig._6_1_ = 0;
                writeinfo = (char *)tool_stderr;
              }
              else if (iVar3 == 0x44) {
                if ((name.toobig._6_1_ & 1) != 0) {
                  fclose((FILE *)writeinfo);
                }
                name.toobig._6_1_ = 0;
                writeinfo = _stdout;
              }
              else {
                (**(code **)(find.writefunc + 0x10))(writeinfo,find.writefunc,per,per_result,0);
              }
            }
            pcStack_38 = pcVar4 + 1;
          }
        }
        else {
          iVar3 = strncmp("header{",pcStack_38 + 1,7);
          if (iVar3 == 0) {
            pcStack_38 = pcStack_38 + 8;
            pcVar4 = strchr(pcStack_38,0x7d);
            if (pcVar4 == (char *)0x0) {
              fputs("%header{",(FILE *)writeinfo);
            }
            else {
              uVar5 = (long)pcVar4 - (long)pcStack_38;
              if (uVar5 < 0x100) {
                memcpy(&header,pcStack_38,uVar5);
                hname[uVar5 - 8] = '\0';
                iVar3 = curl_easy_header(per->curl,&header,0,1,0xffffffff,&stack0xfffffffffffffe60);
                if (iVar3 == 0) {
                  fputs(*(char **)(lStack_1a0 + 8),(FILE *)writeinfo);
                }
              }
              pcStack_38 = pcVar4 + 1;
            }
          }
          else {
            iVar3 = strncmp("output{",pcStack_38 + 1,7);
            if (iVar3 == 0) {
              fname[0x1ff] = '\0';
              pcVar4 = pcStack_38 + 8;
              if ((*pcVar4 == '>') && (pcStack_38[9] == '>')) {
                fname[0x1ff] = '\x01';
                pcVar4 = pcStack_38 + 10;
              }
              pcStack_38 = pcVar4;
              pcVar4 = strchr(pcStack_38,0x7d);
              if (pcVar4 == (char *)0x0) {
                fputs("%output{",(FILE *)writeinfo);
              }
              else {
                uVar5 = (long)pcVar4 - (long)pcStack_38;
                if (uVar5 < 0x200) {
                  memcpy(&flen,pcStack_38,uVar5);
                  fname[uVar5 - 8] = '\0';
                  __modes = "w";
                  if ((fname[0x1ff] & 1U) != 0) {
                    __modes = "a";
                  }
                  pFVar6 = fopen64((char *)&flen,__modes);
                  if (pFVar6 != (FILE *)0x0) {
                    if ((name.toobig._6_1_ & 1) != 0) {
                      fclose((FILE *)writeinfo);
                    }
                    name.toobig._6_1_ = 1;
                    writeinfo = (char *)pFVar6;
                  }
                }
                pcStack_38 = pcVar4 + 1;
              }
            }
            else {
              fputc(0x25,(FILE *)writeinfo);
              fputc((int)pcStack_38[1],(FILE *)writeinfo);
              pcStack_38 = pcStack_38 + 2;
            }
          }
        }
      }
      else if ((*pcStack_38 == '\\') && (pcStack_38[1] != '\0')) {
        cVar1 = pcStack_38[1];
        if (cVar1 == 'n') {
          fputc(10,(FILE *)writeinfo);
        }
        else if (cVar1 == 'r') {
          fputc(0xd,(FILE *)writeinfo);
        }
        else if (cVar1 == 't') {
          fputc(9,(FILE *)writeinfo);
        }
        else {
          fputc((int)*pcStack_38,(FILE *)writeinfo);
          fputc((int)pcStack_38[1],(FILE *)writeinfo);
        }
        pcStack_38 = pcStack_38 + 2;
      }
      else {
        fputc((int)*pcStack_38,(FILE *)writeinfo);
        pcStack_38 = pcStack_38 + 1;
      }
    }
    if ((name.toobig._6_1_ & 1) != 0) {
      fclose((FILE *)writeinfo);
    }
    curlx_dyn_free((dynbuf *)&end);
  }
  return;
}

Assistant:

void ourWriteOut(struct OperationConfig *config, struct per_transfer *per,
                 CURLcode per_result)
{
  FILE *stream = stdout;
  const char *writeinfo = config->writeout;
  const char *ptr = writeinfo;
  bool done = FALSE;
  bool fclose_stream = FALSE;
  struct dynbuf name;

  if(!writeinfo)
    return;

  curlx_dyn_init(&name, MAX_WRITEOUT_NAME_LENGTH);
  while(ptr && *ptr && !done) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        size_t vlen;
        if('{' == ptr[1]) {
          struct writeoutvar *wv = NULL;
          struct writeoutvar find = { 0 };
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          vlen = end - ptr;

          curlx_dyn_reset(&name);
          if(!curlx_dyn_addn(&name, ptr, vlen)) {
            find.name = curlx_dyn_ptr(&name);
            wv = bsearch(&find,
                         variables, CURL_ARRAYSIZE(variables),
                         sizeof(variables[0]), matchvar);
          }
          if(wv) {
            switch(wv->id) {
            case VAR_ONERROR:
              if(per_result == CURLE_OK)
                /* this is not error so skip the rest */
                done = TRUE;
              break;
            case VAR_STDOUT:
              if(fclose_stream)
                fclose(stream);
              fclose_stream = FALSE;
              stream = stdout;
              break;
            case VAR_STDERR:
              if(fclose_stream)
                fclose(stream);
              fclose_stream = FALSE;
              stream = tool_stderr;
              break;
            case VAR_JSON:
              ourWriteOutJSON(stream, variables,
                              CURL_ARRAYSIZE(variables),
                              per, per_result);
              break;
            case VAR_HEADER_JSON:
              headerJSON(stream, per);
              break;
            default:
              (void)wv->writefunc(stream, wv, per, per_result, false);
              break;
            }
          }
          else {
            fprintf(tool_stderr,
                    "curl: unknown --write-out variable: '%.*s'\n",
                    (int)vlen, ptr);
          }
          ptr = end + 1; /* pass the end */
        }
        else if(!strncmp("header{", &ptr[1], 7)) {
          ptr += 8;
          end = strchr(ptr, '}');
          if(end) {
            char hname[256]; /* holds the longest header field name */
            struct curl_header *header;
            vlen = end - ptr;
            if(vlen < sizeof(hname)) {
              memcpy(hname, ptr, vlen);
              hname[vlen] = 0;
              if(CURLHE_OK == curl_easy_header(per->curl, hname, 0,
                                               CURLH_HEADER, -1, &header))
                fputs(header->value, stream);
            }
            ptr = end + 1;
          }
          else
            fputs("%header{", stream);
        }
        else if(!strncmp("output{", &ptr[1], 7)) {
          bool append = FALSE;
          ptr += 8;
          if((ptr[0] == '>') && (ptr[1] == '>')) {
            append = TRUE;
            ptr += 2;
          }
          end = strchr(ptr, '}');
          if(end) {
            char fname[512]; /* holds the longest filename */
            size_t flen = end - ptr;
            if(flen < sizeof(fname)) {
              FILE *stream2;
              memcpy(fname, ptr, flen);
              fname[flen] = 0;
              stream2 = fopen(fname, append ? FOPEN_APPENDTEXT :
                              FOPEN_WRITETEXT);
              if(stream2) {
                /* only change if the open worked */
                if(fclose_stream)
                  fclose(stream);
                stream = stream2;
                fclose_stream = TRUE;
              }
            }
            ptr = end + 1;
          }
          else
            fputs("%output{", stream);
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }
  if(fclose_stream)
    fclose(stream);
  curlx_dyn_free(&name);
}